

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

vec * construct_rhs(vec *__return_storage_ptr__,int nx,int nt,vec *previous_layer,double t,
                   function_2var f,function_2var u)

{
  double *pdVar1;
  pointer pdVar2;
  function_2var p_Var3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  allocator_type local_61;
  double local_60;
  function_2var local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  value_type_conflict local_38;
  
  local_60 = t;
  local_58 = u;
  if (construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
      ::size == '\0') {
    iVar4 = __cxa_guard_acquire(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                                 ::size);
    if (iVar4 != 0) {
      construct_rhs::size = compute_linear_system_size(nx + -1);
      __cxa_guard_release(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                           ::size);
    }
  }
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)construct_rhs::size,&local_38,&local_61);
  if (construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
      ::h == '\0') {
    iVar4 = __cxa_guard_acquire(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                                 ::h);
    if (iVar4 != 0) {
      construct_rhs::h = 0.7853981633974483 / (double)nx;
      __cxa_guard_release(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                           ::h);
    }
  }
  if (construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
      ::tau == '\0') {
    iVar4 = __cxa_guard_acquire(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                                 ::tau);
    if (iVar4 != 0) {
      construct_rhs::tau = 1.0 / (double)nt;
      __cxa_guard_release(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                           ::tau);
    }
  }
  iVar4 = 1;
  if (1 < nx) {
    iVar4 = nx;
  }
  for (uVar5 = 0; p_Var3 = local_58, iVar4 - 1 != uVar5; uVar5 = uVar5 + 1) {
    local_48 = (previous_layer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar5];
    uStack_40 = 0;
    local_50 = construct_rhs::tau;
    dVar6 = (*f)((double)((int)uVar5 + 1) * construct_rhs::h,local_60);
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar5] = -local_48 / local_50 - dVar6;
  }
  dVar6 = (*local_58)(0.0,local_60);
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar1 = *pdVar1 - (dVar6 / construct_rhs::h) / construct_rhs::h;
  dVar6 = (*p_Var3)(0.7853981633974483,local_60);
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[(long)nx + -2] = pdVar2[(long)nx + -2] - (dVar6 / construct_rhs::h) / construct_rhs::h;
  return __return_storage_ptr__;
}

Assistant:

vec construct_rhs(int nx, int nt, const vec& previous_layer,
        double t, function_2var f, function_2var u)
{
    static int size = compute_linear_system_size(nx - 1);

    vec rhs(size, 0.0);

    static double h = X / nx;
    static double tau = T / nt;

    for (int i = 0; i < nx - 1; i++)
    {
        rhs[i] = -previous_layer[i] / tau - f(h * (i + 1), t);
    }

    rhs[0] -= u(0.0, t) / h / h;
    rhs[nx - 2] -= u(X, t) / h / h;

    return rhs;
}